

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mish_x86.cpp
# Opt level: O0

int __thiscall ncnn::Mish_x86::forward_inplace(Mish_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  undefined8 uVar1;
  undefined8 uVar2;
  ulong uVar3;
  ulong uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  long *in_RSI;
  float fVar16;
  float fVar18;
  float fVar19;
  undefined1 auVar17 [16];
  float fVar20;
  int iVar21;
  ulong uVar22;
  ulong uVar23;
  __m128 _p;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  Mat *m;
  __m128 two;
  __m128 one_2;
  v4sf y_1;
  v4sf z;
  v4sf tmp_1;
  v4sf mask_1;
  v4sf e;
  v4sf invalid_mask;
  v4sf one_1;
  v4si emm0_1;
  v4sf pow2n;
  v4sf y;
  v4sf mask;
  v4sf one;
  v4si emm0;
  v4sf fx;
  v4sf tmp;
  __m128 one_3;
  v4sf pow2n_1;
  v4sf y_2;
  v4sf mask_2;
  v4sf one_4;
  v4si emm0_2;
  v4sf fx_1;
  v4sf tmp_2;
  undefined8 local_1568;
  undefined8 uStack_1560;
  int local_1550;
  undefined8 local_1540;
  undefined8 local_1538;
  undefined8 local_1530;
  undefined4 local_1528;
  long local_1520;
  undefined4 local_1518;
  undefined4 local_1514;
  undefined4 local_1510;
  undefined4 local_150c;
  undefined4 local_1508;
  undefined8 local_1500;
  undefined1 (*local_14f8) [16];
  int local_14ec;
  int local_14e8;
  int local_14e4;
  int local_14e0;
  int local_14dc;
  int local_14d8;
  int local_14d4;
  long *local_14c8;
  undefined1 local_14b5;
  int local_14b4;
  undefined8 *local_14a8;
  undefined8 *local_14a0;
  undefined8 *local_1490;
  undefined1 (*local_1480) [16];
  undefined8 local_1478;
  undefined8 uStack_1470;
  undefined8 local_1468;
  undefined8 uStack_1460;
  undefined1 (*local_1450) [16];
  long local_1448;
  undefined4 local_143c;
  long local_1438;
  undefined1 (*local_1430) [16];
  undefined4 local_1424;
  int local_1420;
  int local_141c;
  undefined8 *local_1418;
  undefined4 local_140c;
  long local_1408;
  undefined8 *local_13e8;
  float local_13b8;
  float fStack_13b4;
  float fStack_13b0;
  float fStack_13ac;
  undefined8 local_13a8;
  undefined8 uStack_13a0;
  undefined8 local_1398;
  undefined8 uStack_1390;
  undefined8 local_1388;
  undefined8 uStack_1380;
  ulong local_1378;
  ulong uStack_1370;
  undefined8 local_1368;
  undefined8 uStack_1360;
  undefined1 local_1358 [8];
  float fStack_1350;
  float fStack_134c;
  undefined8 local_1348;
  undefined8 uStack_1340;
  undefined8 local_1338;
  undefined8 uStack_1330;
  undefined8 local_1328;
  undefined8 uStack_1320;
  float local_1318;
  float fStack_1314;
  float fStack_1310;
  float fStack_130c;
  ulong local_1308;
  ulong uStack_1300;
  int local_12f8;
  int iStack_12f4;
  int iStack_12f0;
  int iStack_12ec;
  float local_12e8;
  float fStack_12e4;
  float fStack_12e0;
  float fStack_12dc;
  int local_12d8;
  int iStack_12d4;
  int iStack_12d0;
  int iStack_12cc;
  undefined8 local_12c8;
  undefined8 uStack_12c0;
  int local_12b8;
  int iStack_12b4;
  int iStack_12b0;
  int iStack_12ac;
  undefined8 local_12a8;
  undefined8 uStack_12a0;
  undefined8 local_1298;
  undefined8 uStack_1290;
  undefined8 local_1288;
  undefined8 uStack_1280;
  undefined8 local_1278;
  undefined8 uStack_1270;
  undefined8 local_1268;
  undefined8 uStack_1260;
  undefined8 local_1258;
  undefined8 uStack_1250;
  undefined8 local_1248;
  undefined8 uStack_1240;
  undefined8 local_1238;
  undefined8 uStack_1230;
  undefined8 local_1228;
  undefined8 uStack_1220;
  undefined8 local_1218;
  undefined8 uStack_1210;
  undefined8 local_1208;
  undefined8 uStack_1200;
  undefined8 local_11f8;
  undefined8 uStack_11f0;
  undefined8 local_11e8;
  undefined8 uStack_11e0;
  undefined8 local_11d8;
  undefined8 uStack_11d0;
  undefined8 local_11c8;
  undefined8 uStack_11c0;
  undefined8 local_11b8;
  undefined8 uStack_11b0;
  undefined8 local_11a8;
  undefined8 uStack_11a0;
  undefined8 local_1198;
  undefined8 uStack_1190;
  undefined8 local_1188;
  undefined8 uStack_1180;
  float local_1178;
  float fStack_1174;
  float fStack_1170;
  float fStack_116c;
  float local_1168;
  float fStack_1164;
  float fStack_1160;
  float fStack_115c;
  undefined8 local_1158;
  undefined8 uStack_1150;
  undefined8 local_1148;
  undefined8 uStack_1140;
  undefined8 local_1138;
  undefined8 uStack_1130;
  undefined8 local_1128;
  undefined8 uStack_1120;
  undefined8 local_1118;
  undefined8 uStack_1110;
  undefined8 local_1108;
  undefined8 uStack_1100;
  undefined8 local_10f8;
  undefined8 uStack_10f0;
  undefined8 local_10e8;
  undefined8 uStack_10e0;
  undefined8 local_10d8;
  undefined8 uStack_10d0;
  undefined8 local_10c8;
  undefined8 uStack_10c0;
  undefined8 local_10b8;
  undefined8 uStack_10b0;
  undefined8 local_10a8;
  undefined8 uStack_10a0;
  undefined4 local_1098;
  undefined4 uStack_1094;
  undefined4 uStack_1090;
  undefined4 uStack_108c;
  undefined4 local_107c;
  undefined4 local_1078;
  undefined4 uStack_1074;
  undefined4 uStack_1070;
  undefined4 uStack_106c;
  undefined4 local_105c;
  undefined4 local_1058;
  undefined4 uStack_1054;
  undefined4 uStack_1050;
  undefined4 uStack_104c;
  undefined4 local_103c;
  undefined8 local_1038;
  undefined8 uStack_1030;
  undefined8 local_1028;
  undefined8 uStack_1020;
  undefined8 local_1018;
  undefined8 uStack_1010;
  undefined8 local_1008;
  undefined8 uStack_1000;
  undefined8 local_ff8;
  undefined8 uStack_ff0;
  ulong local_fe8;
  ulong uStack_fe0;
  undefined8 local_fd8;
  undefined8 uStack_fd0;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  undefined8 local_fb8;
  undefined8 uStack_fb0;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  undefined8 local_f98;
  undefined8 uStack_f90;
  undefined8 local_f88;
  undefined8 uStack_f80;
  undefined8 local_f78;
  undefined8 uStack_f70;
  undefined8 local_f68;
  undefined8 uStack_f60;
  undefined8 local_f58;
  undefined8 uStack_f50;
  undefined8 local_f48;
  undefined8 uStack_f40;
  float local_f38;
  float fStack_f34;
  float fStack_f30;
  float fStack_f2c;
  float local_f28;
  float fStack_f24;
  float fStack_f20;
  float fStack_f1c;
  float local_f18;
  float fStack_f14;
  float fStack_f10;
  float fStack_f0c;
  undefined8 local_f08;
  undefined8 uStack_f00;
  undefined8 local_ef8;
  undefined8 uStack_ef0;
  undefined8 local_ee8;
  undefined8 uStack_ee0;
  undefined8 local_ed8;
  undefined8 uStack_ed0;
  undefined8 local_ec8;
  undefined8 uStack_ec0;
  undefined8 local_eb8;
  undefined8 uStack_eb0;
  undefined8 local_ea8;
  undefined8 uStack_ea0;
  undefined8 local_e98;
  undefined8 uStack_e90;
  undefined8 local_e88;
  undefined8 uStack_e80;
  undefined8 local_e78;
  undefined8 uStack_e70;
  undefined8 local_e68;
  undefined8 uStack_e60;
  undefined4 local_e58;
  undefined4 uStack_e54;
  undefined4 uStack_e50;
  undefined4 uStack_e4c;
  undefined4 local_e3c;
  undefined8 local_e38;
  undefined8 uStack_e30;
  undefined8 local_e28;
  undefined8 uStack_e20;
  undefined8 local_e18;
  undefined8 uStack_e10;
  undefined8 local_e08;
  undefined8 uStack_e00;
  float local_df8;
  float fStack_df4;
  float fStack_df0;
  float fStack_dec;
  undefined8 local_de8;
  undefined8 uStack_de0;
  undefined8 local_dd8;
  undefined8 uStack_dd0;
  undefined8 local_dc8;
  undefined8 uStack_dc0;
  undefined8 local_db8;
  undefined8 uStack_db0;
  undefined8 local_da8;
  undefined8 uStack_da0;
  undefined8 local_d98;
  undefined8 uStack_d90;
  undefined8 local_d88;
  undefined8 uStack_d80;
  undefined8 local_d78;
  undefined8 uStack_d70;
  undefined8 local_d68;
  undefined8 uStack_d60;
  undefined8 local_d58;
  undefined8 uStack_d50;
  undefined8 local_d48;
  undefined8 uStack_d40;
  undefined8 local_d38;
  undefined8 uStack_d30;
  undefined8 local_d28;
  undefined8 uStack_d20;
  undefined4 local_d0c;
  undefined8 local_d08;
  undefined8 uStack_d00;
  ulong local_cf8;
  ulong uStack_cf0;
  undefined8 local_ce8;
  undefined8 uStack_ce0;
  ulong local_cd8;
  ulong uStack_cd0;
  undefined8 local_cc8;
  undefined8 uStack_cc0;
  ulong local_cb8;
  ulong uStack_cb0;
  ulong local_ca8;
  ulong uStack_ca0;
  undefined8 local_c98;
  undefined8 uStack_c90;
  ulong local_c88;
  ulong uStack_c80;
  ulong local_c78;
  ulong uStack_c70;
  undefined8 local_c68;
  undefined8 uStack_c60;
  ulong local_c58;
  ulong uStack_c50;
  ulong local_c48;
  ulong uStack_c40;
  ulong local_c38;
  ulong uStack_c30;
  undefined8 local_c28;
  undefined8 uStack_c20;
  ulong local_c18;
  ulong uStack_c10;
  undefined8 local_c08;
  undefined8 uStack_c00;
  undefined8 local_bf8;
  undefined8 uStack_bf0;
  undefined8 local_be8;
  undefined8 uStack_be0;
  undefined8 local_bd8;
  undefined8 uStack_bd0;
  undefined8 local_bc8;
  undefined8 uStack_bc0;
  undefined8 local_bb8;
  undefined8 uStack_bb0;
  undefined8 local_ba8;
  undefined8 uStack_ba0;
  undefined8 *local_b90;
  float *local_b88;
  undefined8 *local_b80;
  undefined8 local_b78;
  undefined8 uStack_b70;
  undefined8 local_b68;
  undefined8 uStack_b60;
  undefined8 local_b58;
  undefined8 uStack_b50;
  float local_b48;
  float fStack_b44;
  float fStack_b40;
  float fStack_b3c;
  float *local_b30;
  undefined8 *local_b28;
  undefined8 *local_b20;
  undefined8 local_b18;
  undefined8 uStack_b10;
  undefined8 local_b08;
  undefined8 uStack_b00;
  float local_af8 [2];
  float afStack_af0 [2];
  float local_ae8;
  float fStack_ae4;
  float fStack_ae0;
  float fStack_adc;
  float *local_ad0;
  undefined8 *local_ac8;
  undefined8 *local_ac0;
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  undefined8 local_aa8;
  undefined8 uStack_aa0;
  float local_a98 [2];
  float afStack_a90 [2];
  float local_a88;
  float fStack_a84;
  float fStack_a80;
  float fStack_a7c;
  float *local_a70;
  undefined8 *local_a68;
  undefined8 *local_a60;
  undefined8 local_a58;
  undefined8 uStack_a50;
  undefined8 local_a48;
  undefined8 uStack_a40;
  float local_a38 [2];
  float afStack_a30 [2];
  float local_a28;
  float fStack_a24;
  float fStack_a20;
  float fStack_a1c;
  float *local_a10;
  undefined8 *local_a08;
  undefined8 *local_a00;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  float local_9d8 [2];
  float afStack_9d0 [2];
  float local_9c8;
  float fStack_9c4;
  float fStack_9c0;
  float fStack_9bc;
  float *local_9b0;
  undefined8 *local_9a8;
  undefined8 *local_9a0;
  undefined8 local_998;
  undefined8 uStack_990;
  undefined8 local_988;
  undefined8 uStack_980;
  float local_978 [2];
  float afStack_970 [2];
  float local_968;
  float fStack_964;
  float fStack_960;
  float fStack_95c;
  undefined8 *local_950;
  undefined8 *local_948;
  undefined8 *local_940;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined8 local_918;
  undefined8 uStack_910;
  float local_908;
  float fStack_904;
  float fStack_900;
  float fStack_8fc;
  float *local_8f0;
  undefined8 *local_8e8;
  undefined8 *local_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  float local_8b8 [2];
  float afStack_8b0 [2];
  float local_8a8;
  float fStack_8a4;
  float fStack_8a0;
  float fStack_89c;
  float *local_890;
  undefined8 *local_888;
  undefined8 *local_880;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 local_868;
  undefined8 uStack_860;
  float local_858 [2];
  float afStack_850 [2];
  float local_848;
  float fStack_844;
  float fStack_840;
  float fStack_83c;
  float *local_830;
  undefined8 *local_828;
  undefined8 *local_820;
  undefined8 local_818;
  undefined8 uStack_810;
  undefined8 local_808;
  undefined8 uStack_800;
  float local_7f8 [2];
  float afStack_7f0 [2];
  float local_7e8;
  float fStack_7e4;
  float fStack_7e0;
  float fStack_7dc;
  float *local_7d0;
  undefined8 *local_7c8;
  undefined8 *local_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  float local_798 [2];
  float afStack_790 [2];
  float local_788;
  float fStack_784;
  float fStack_780;
  float fStack_77c;
  float *local_770;
  undefined8 *local_768;
  undefined8 *local_760;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  undefined8 uStack_740;
  float local_738 [2];
  float afStack_730 [2];
  float local_728;
  float fStack_724;
  float fStack_720;
  float fStack_71c;
  undefined8 *local_710;
  float *local_708;
  float *local_700;
  float local_6f8 [2];
  float afStack_6f0 [2];
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  float local_6c8;
  float fStack_6c4;
  float fStack_6c0;
  float fStack_6bc;
  undefined8 *local_6b0;
  float *local_6a8;
  float *local_6a0;
  float local_698 [2];
  float afStack_690 [2];
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  float local_668;
  float fStack_664;
  float fStack_660;
  float fStack_65c;
  float *local_650;
  undefined8 *local_648;
  undefined8 *local_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  float local_618 [2];
  float afStack_610 [2];
  float local_608;
  float fStack_604;
  float fStack_600;
  float fStack_5fc;
  float *local_5f0;
  undefined8 *local_5e8;
  undefined8 *local_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  float local_5b8 [2];
  float afStack_5b0 [2];
  float local_5a8;
  float fStack_5a4;
  float fStack_5a0;
  float fStack_59c;
  float *local_590;
  undefined8 *local_588;
  undefined8 *local_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  float local_558 [2];
  float afStack_550 [2];
  float local_548;
  float fStack_544;
  float fStack_540;
  float fStack_53c;
  float *local_530;
  undefined8 *local_528;
  undefined8 *local_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  float local_4f8 [2];
  float afStack_4f0 [2];
  float local_4e8;
  float fStack_4e4;
  float fStack_4e0;
  float fStack_4dc;
  float *local_4d0;
  undefined8 *local_4c8;
  undefined8 *local_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  float local_498 [2];
  float afStack_490 [2];
  float local_488;
  float fStack_484;
  float fStack_480;
  float fStack_47c;
  float *local_470;
  undefined8 *local_468;
  undefined8 *local_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  float local_438 [2];
  float afStack_430 [2];
  float local_428;
  float fStack_424;
  float fStack_420;
  float fStack_41c;
  float *local_410;
  undefined8 *local_408;
  undefined8 *local_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  float local_3d8 [2];
  float afStack_3d0 [2];
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  float *local_3b0;
  undefined8 *local_3a8;
  undefined8 *local_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  float local_378 [2];
  float afStack_370 [2];
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  undefined8 *local_350;
  float *local_348;
  float *local_340;
  float local_338 [2];
  float afStack_330 [2];
  undefined8 local_328;
  undefined8 uStack_320;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 *local_2f0;
  float *local_2e8;
  float *local_2e0;
  float local_2d8 [2];
  float afStack_2d0 [2];
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 *local_290;
  float *local_288;
  float *local_280;
  float local_278 [2];
  float afStack_270 [2];
  undefined8 local_268;
  undefined8 uStack_260;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 *local_230;
  float *local_228;
  float *local_220;
  float local_218 [2];
  float afStack_210 [2];
  undefined8 local_208;
  undefined8 uStack_200;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 *local_1d0;
  float *local_1c8;
  float *local_1c0;
  float local_1b8 [2];
  float afStack_1b0 [2];
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined4 local_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined4 local_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_14d4 = *(int *)((long)in_RSI + 0x2c);
  local_14d8 = (int)in_RSI[6];
  local_14dc = *(int *)((long)in_RSI + 0x34);
  local_14e0 = (int)in_RSI[7];
  local_14e4 = (int)in_RSI[3];
  local_14e8 = local_14d4 * local_14d8 * local_14dc * local_14e4;
  local_14c8 = in_RSI;
  for (local_14ec = 0; local_14ec < local_14e0; local_14ec = local_14ec + 1) {
    local_14a8 = &local_1540;
    local_141c = *(int *)((long)local_14c8 + 0x2c);
    local_1420 = (int)local_14c8[6];
    local_1424 = *(undefined4 *)((long)local_14c8 + 0x34);
    local_1430 = (undefined1 (*) [16])
                 (*local_14c8 + local_14c8[8] * (long)local_14ec * local_14c8[2]);
    local_1438 = local_14c8[2];
    local_143c = (undefined4)local_14c8[3];
    local_1448 = local_14c8[4];
    local_1418 = &local_1540;
    local_1408 = (long)local_141c * (long)local_1420 * local_1438;
    local_14a0 = &local_1540;
    local_1490 = &local_1540;
    local_140c = 0x10;
    local_14b4 = local_14ec;
    local_14b5 = 1;
    local_1540 = 0;
    local_1530 = 0;
    local_1528 = 0;
    local_1518 = 0;
    local_1514 = 0;
    local_1510 = 0;
    local_150c = 0;
    local_1508 = 0;
    local_1500 = 0;
    local_1538 = 0;
    local_14f8 = local_1430;
    for (local_1550 = 0; local_13e8 = local_1490, local_1520 = local_1448,
        local_1550 + 3 < local_14e8; local_1550 = local_1550 + 4) {
      local_1480 = local_14f8;
      local_1478 = *(undefined8 *)*local_14f8;
      uStack_1470 = *(undefined8 *)(*local_14f8 + 8);
      local_db8 = 0;
      uStack_db0 = 0;
      local_12c8 = 0x3f8000003f800000;
      uStack_12c0 = 0x3f8000003f800000;
      local_178 = 0x42b0c0a542b0c0a5;
      uStack_170 = 0x42b0c0a542b0c0a5;
      auVar15._8_8_ = 0x42b0c0a542b0c0a5;
      auVar15._0_8_ = 0x42b0c0a542b0c0a5;
      auVar17 = minps(*local_14f8,auVar15);
      local_1148 = auVar17._0_8_;
      local_d48 = local_1148;
      uStack_1140 = auVar17._8_8_;
      uStack_d40 = uStack_1140;
      local_d78 = 0xc2b0c0a5c2b0c0a5;
      uStack_d70 = 0xc2b0c0a5c2b0c0a5;
      auVar10._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar10._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar17 = maxps(auVar17,auVar10);
      local_1148 = auVar17._0_8_;
      uVar1 = local_1148;
      uStack_1140 = auVar17._8_8_;
      uVar2 = uStack_1140;
      local_10f8 = 0x3fb8aa3b3fb8aa3b;
      uStack_10f0 = 0x3fb8aa3b3fb8aa3b;
      local_10e8._0_4_ = auVar17._0_4_;
      local_10e8._4_4_ = auVar17._4_4_;
      uStack_10e0._0_4_ = auVar17._8_4_;
      uStack_10e0._4_4_ = auVar17._12_4_;
      local_10a8 = CONCAT44(local_10e8._4_4_ * 1.442695,(float)local_10e8 * 1.442695);
      uStack_10a0 = CONCAT44(uStack_10e0._4_4_ * 1.442695,(float)uStack_10e0 * 1.442695);
      local_10b8 = 0x3f0000003f000000;
      uStack_10b0 = 0x3f0000003f000000;
      fVar16 = (float)local_10e8 * 1.442695 + 0.5;
      fVar18 = local_10e8._4_4_ * 1.442695 + 0.5;
      fVar19 = (float)uStack_10e0 * 1.442695 + 0.5;
      fVar20 = uStack_10e0._4_4_ * 1.442695 + 0.5;
      local_108 = CONCAT44(fVar18,fVar16);
      uStack_100 = CONCAT44(fVar20,fVar19);
      local_bd8 = CONCAT44((int)fVar18,(int)fVar16);
      uStack_bd0 = CONCAT44((int)fVar20,(int)fVar19);
      local_1168 = (float)(int)fVar16;
      fStack_1164 = (float)(int)fVar18;
      fStack_1160 = (float)(int)fVar19;
      fStack_115c = (float)(int)fVar20;
      local_1158 = CONCAT44(fStack_1164,local_1168);
      uStack_1150 = CONCAT44(fStack_115c,fStack_1160);
      local_c8 = local_1158;
      uStack_c0 = uStack_1150;
      local_d8 = CONCAT44(fVar18,fVar16);
      uStack_d0 = CONCAT44(fVar20,fVar19);
      local_1198 = CONCAT44(-(uint)(fVar18 < fStack_1164),-(uint)(fVar16 < local_1168));
      uStack_1190 = CONCAT44(-(uint)(fVar20 < fStack_115c),-(uint)(fVar19 < fStack_1160));
      local_cb8 = local_1198;
      uStack_cb0 = uStack_1190;
      local_cc8 = 0x3f8000003f800000;
      uStack_cc0 = 0x3f8000003f800000;
      local_1198 = local_1198 & 0x3f8000003f800000;
      uStack_1190 = uStack_1190 & 0x3f8000003f800000;
      local_1028 = local_1158;
      uStack_1020 = uStack_1150;
      local_1038._0_4_ = (float)local_1198;
      local_1038._4_4_ = (float)(local_1198 >> 0x20);
      uStack_1030._0_4_ = (float)uStack_1190;
      uStack_1030._4_4_ = (float)(uStack_1190 >> 0x20);
      local_1168 = local_1168 - (float)local_1038;
      fStack_1164 = fStack_1164 - local_1038._4_4_;
      fStack_1160 = fStack_1160 - (float)uStack_1030;
      fStack_115c = fStack_115c - uStack_1030._4_4_;
      local_280 = &local_1168;
      local_228 = ::_ps_cephes_exp_C1;
      local_950 = &local_1148;
      local_1e8 = local_1148;
      uStack_1e0 = uStack_1140;
      local_208 = CONCAT44(fStack_1164,local_1168);
      uStack_200 = CONCAT44(fStack_115c,fStack_1160);
      local_218[0] = 0.6933594;
      local_218[1] = 0.6933594;
      afStack_210[0] = 0.6933594;
      afStack_210[1] = 0.6933594;
      local_1f8 = local_1168 * 0.6933594;
      fStack_1f4 = fStack_1164 * 0.6933594;
      fStack_1f0 = fStack_1160 * 0.6933594;
      fStack_1ec = fStack_115c * 0.6933594;
      local_1148 = CONCAT44(local_10e8._4_4_ - fStack_1f4,(float)local_10e8 - local_1f8);
      uStack_1140._0_4_ = (float)uStack_10e0 - fStack_1f0;
      uStack_1140._4_4_ = uStack_10e0._4_4_ - fStack_1ec;
      local_288 = ::_ps_cephes_exp_C2;
      local_248 = local_1148;
      uStack_240 = uStack_1140;
      local_268 = CONCAT44(fStack_1164,local_1168);
      uStack_260 = CONCAT44(fStack_115c,fStack_1160);
      local_278[0] = -0.00021219444;
      local_278[1] = -0.00021219444;
      afStack_270[0] = -0.00021219444;
      afStack_270[1] = -0.00021219444;
      local_258 = local_1168 * -0.00021219444;
      fStack_254 = fStack_1164 * -0.00021219444;
      fStack_250 = fStack_1160 * -0.00021219444;
      fStack_24c = fStack_115c * -0.00021219444;
      fVar16 = ((float)local_10e8 - local_1f8) - local_258;
      fVar18 = (local_10e8._4_4_ - fStack_1f4) - fStack_254;
      fVar19 = ((float)uStack_10e0 - fStack_1f0) - fStack_250;
      fVar20 = (uStack_10e0._4_4_ - fStack_1ec) - fStack_24c;
      local_1148 = CONCAT44(fVar18,fVar16);
      uStack_1140._0_4_ = fVar19;
      uStack_1140._4_4_ = fVar20;
      local_1118 = local_1148;
      uStack_1110 = uStack_1140;
      local_1158 = CONCAT44(fVar18 * fVar18,fVar16 * fVar16);
      uStack_1150 = CONCAT44(fVar20 * fVar20,fVar19 * fVar19);
      local_940 = &local_11a8;
      local_770 = ::_ps_cephes_exp_p1;
      local_748 = 0x3950696739506967;
      uStack_740 = 0x3950696739506967;
      local_758 = local_1148;
      uStack_750 = uStack_1140;
      local_728 = fVar16 * 0.00019875691;
      fStack_724 = fVar18 * 0.00019875691;
      fStack_720 = fVar19 * 0.00019875691;
      fStack_71c = fVar20 * 0.00019875691;
      local_738[0] = 0.0013981999;
      local_738[1] = 0.0013981999;
      afStack_730[0] = 0.0013981999;
      afStack_730[1] = 0.0013981999;
      local_11a8 = CONCAT44(fStack_724 + 0.0013981999,local_728 + 0.0013981999);
      uStack_11a0 = CONCAT44(fStack_71c + 0.0013981999,fStack_720 + 0.0013981999);
      local_7d0 = ::_ps_cephes_exp_p2;
      local_7a8 = local_11a8;
      uStack_7a0 = uStack_11a0;
      local_7b8 = local_1148;
      uStack_7b0 = uStack_1140;
      local_788 = (local_728 + 0.0013981999) * fVar16;
      fStack_784 = (fStack_724 + 0.0013981999) * fVar18;
      fStack_780 = (fStack_720 + 0.0013981999) * fVar19;
      fStack_77c = (fStack_71c + 0.0013981999) * fVar20;
      local_798[0] = 0.008333452;
      local_798[1] = 0.008333452;
      afStack_790[0] = 0.008333452;
      afStack_790[1] = 0.008333452;
      local_11a8 = CONCAT44(fStack_784 + 0.008333452,local_788 + 0.008333452);
      uStack_11a0 = CONCAT44(fStack_77c + 0.008333452,fStack_780 + 0.008333452);
      local_830 = ::_ps_cephes_exp_p3;
      local_808 = local_11a8;
      uStack_800 = uStack_11a0;
      local_818 = local_1148;
      uStack_810 = uStack_1140;
      local_7e8 = (local_788 + 0.008333452) * fVar16;
      fStack_7e4 = (fStack_784 + 0.008333452) * fVar18;
      fStack_7e0 = (fStack_780 + 0.008333452) * fVar19;
      fStack_7dc = (fStack_77c + 0.008333452) * fVar20;
      local_7f8[0] = 0.041665796;
      local_7f8[1] = 0.041665796;
      afStack_7f0[0] = 0.041665796;
      afStack_7f0[1] = 0.041665796;
      local_11a8 = CONCAT44(fStack_7e4 + 0.041665796,local_7e8 + 0.041665796);
      uStack_11a0 = CONCAT44(fStack_7dc + 0.041665796,fStack_7e0 + 0.041665796);
      local_890 = ::_ps_cephes_exp_p4;
      local_868 = local_11a8;
      uStack_860 = uStack_11a0;
      local_878 = local_1148;
      uStack_870 = uStack_1140;
      local_848 = (local_7e8 + 0.041665796) * fVar16;
      fStack_844 = (fStack_7e4 + 0.041665796) * fVar18;
      fStack_840 = (fStack_7e0 + 0.041665796) * fVar19;
      fStack_83c = (fStack_7dc + 0.041665796) * fVar20;
      local_858[0] = 0.16666666;
      local_858[1] = 0.16666666;
      afStack_850[0] = 0.16666666;
      afStack_850[1] = 0.16666666;
      local_11a8 = CONCAT44(fStack_844 + 0.16666666,local_848 + 0.16666666);
      uStack_11a0 = CONCAT44(fStack_83c + 0.16666666,fStack_840 + 0.16666666);
      local_8f0 = ::_ps_cephes_exp_p5;
      local_8c8 = local_11a8;
      uStack_8c0 = uStack_11a0;
      local_8d8 = local_1148;
      uStack_8d0 = uStack_1140;
      local_8a8 = (local_848 + 0.16666666) * fVar16;
      fStack_8a4 = (fStack_844 + 0.16666666) * fVar18;
      fStack_8a0 = (fStack_840 + 0.16666666) * fVar19;
      fStack_89c = (fStack_83c + 0.16666666) * fVar20;
      local_8b8[0] = 0.5;
      local_8b8[1] = 0.5;
      afStack_8b0[0] = 0.5;
      afStack_8b0[1] = 0.5;
      local_11a8 = CONCAT44(fStack_8a4 + 0.5,local_8a8 + 0.5);
      uStack_11a0 = CONCAT44(fStack_89c + 0.5,fStack_8a0 + 0.5);
      local_948 = &local_1158;
      local_928 = local_11a8;
      uStack_920 = uStack_11a0;
      local_938 = local_1158;
      uStack_930 = uStack_1150;
      local_908 = (local_8a8 + 0.5) * fVar16 * fVar16;
      fStack_904 = (fStack_8a4 + 0.5) * fVar18 * fVar18;
      fStack_900 = (fStack_8a0 + 0.5) * fVar19 * fVar19;
      fStack_8fc = (fStack_89c + 0.5) * fVar20 * fVar20;
      local_918 = local_1148;
      uStack_910 = uStack_1140;
      local_11a8 = CONCAT44(fStack_904 + fVar18,local_908 + fVar16);
      uStack_11a0 = CONCAT44(fStack_8fc + fVar20,fStack_900 + fVar19);
      local_10c8 = local_11a8;
      uStack_10c0 = uStack_11a0;
      local_10d8 = 0x3f8000003f800000;
      uStack_10d0 = 0x3f8000003f800000;
      fVar16 = local_908 + fVar16 + 1.0;
      fVar18 = fStack_904 + fVar18 + 1.0;
      fVar19 = fStack_900 + fVar19 + 1.0;
      fVar20 = fStack_8fc + fVar20 + 1.0;
      local_11a8 = CONCAT44(fVar18,fVar16);
      uStack_11a0 = CONCAT44(fVar20,fVar19);
      local_118 = CONCAT44(fStack_1164,local_1168);
      uStack_110 = CONCAT44(fStack_115c,fStack_1160);
      local_88 = CONCAT44((int)fStack_1164,(int)local_1168);
      uStack_80 = CONCAT44((int)fStack_115c,(int)fStack_1160);
      local_c08 = 0x7f0000007f;
      uStack_c00 = 0x7f0000007f;
      iVar21 = (int)local_1168 + 0x7f;
      fStack_1174 = (float)((int)fStack_1164 + 0x7f);
      fStack_1170 = (float)((int)fStack_1160 + 0x7f);
      fStack_116c = (float)((int)fStack_115c + 0x7f);
      local_48 = CONCAT44(fStack_1174,iVar21);
      uStack_40 = CONCAT44(fStack_116c,fStack_1170);
      local_4c = 0x17;
      local_1178 = (float)(iVar21 * 0x800000);
      local_11b8 = CONCAT44(fStack_1174,local_1178);
      uStack_11b0 = CONCAT44(fStack_116c,fStack_1170);
      local_1128 = local_11a8;
      uStack_1120 = uStack_11a0;
      fVar16 = fVar16 * local_1178;
      fVar18 = fVar18 * fStack_1174;
      fVar19 = fVar19 * fStack_1170;
      fVar20 = fVar20 * fStack_116c;
      local_11a8 = CONCAT44(fVar18,fVar16);
      uStack_11a0 = CONCAT44(fVar20,fVar19);
      local_11c8 = local_11a8;
      uStack_11c0 = uStack_11a0;
      local_103c = 0x3f800000;
      local_1058 = 0x3f800000;
      local_11d8 = 0x3f8000003f800000;
      uStack_11d0 = 0x3f8000003f800000;
      fVar16 = fVar16 + 1.0;
      fVar18 = fVar18 + 1.0;
      fVar19 = fVar19 + 1.0;
      fVar20 = fVar20 + 1.0;
      local_12a8 = CONCAT44(fVar18,fVar16);
      uStack_12a0._0_4_ = fVar19;
      uStack_12a0._4_4_ = fVar20;
      local_d88 = local_12a8;
      uStack_d80 = uStack_12a0;
      local_da8 = 0;
      uStack_da0 = 0;
      local_d98 = 0;
      uStack_d90 = 0;
      local_12d8 = -(uint)(fVar16 <= 0.0);
      iStack_12d4 = -(uint)(fVar18 <= 0.0);
      iStack_12d0 = -(uint)(fVar19 <= 0.0);
      iStack_12cc = -(uint)(fVar20 <= 0.0);
      local_d28 = local_12a8;
      uStack_d20 = uStack_12a0;
      local_d38 = 0x80000000800000;
      uStack_d30 = 0x80000000800000;
      auVar12._8_8_ = uStack_12a0;
      auVar12._0_8_ = local_12a8;
      auVar11._8_8_ = 0x80000000800000;
      auVar11._0_8_ = 0x80000000800000;
      auVar17 = maxps(auVar12,auVar11);
      local_12a8 = auVar17._0_8_;
      local_cf8 = local_12a8;
      uStack_12a0 = auVar17._8_8_;
      uStack_cf0 = uStack_12a0;
      uVar3 = local_12a8;
      uVar4 = uStack_12a0;
      local_d0c = 0x17;
      local_d08._0_4_ = auVar17._0_4_;
      local_d08._4_4_ = auVar17._4_4_;
      uStack_d00._0_4_ = auVar17._8_4_;
      uStack_d00._4_4_ = auVar17._12_4_;
      local_c58 = local_12a8;
      uStack_c50 = uStack_12a0;
      local_c68 = 0x807fffff807fffff;
      uStack_c60 = 0x807fffff807fffff;
      local_c18 = local_12a8 & 0x807fffff807fffff;
      uStack_c10 = uStack_12a0 & 0x807fffff807fffff;
      local_fe8 = local_c18 | 0x3f0000003f000000;
      uStack_fe0 = uStack_c10 | 0x3f0000003f000000;
      local_bf8 = CONCAT44(local_d08._4_4_ >> 0x17,(uint)local_d08 >> 0x17);
      uStack_bf0 = CONCAT44(uStack_d00._4_4_ >> 0x17,(uint)uStack_d00 >> 0x17);
      local_12b8 = ((uint)local_d08 >> 0x17) - 0x7f;
      iStack_12b4 = (local_d08._4_4_ >> 0x17) - 0x7f;
      iStack_12b0 = ((uint)uStack_d00 >> 0x17) - 0x7f;
      iStack_12ac = (uStack_d00._4_4_ >> 0x17) - 0x7f;
      local_bc8 = CONCAT44(iStack_12b4,local_12b8);
      uStack_bc0 = CONCAT44(iStack_12ac,iStack_12b0);
      local_11e8 = CONCAT44((float)iStack_12b4,(float)local_12b8);
      uStack_11e0 = CONCAT44((float)iStack_12ac,(float)iStack_12b0);
      local_11f8 = 0x3f8000003f800000;
      uStack_11f0 = 0x3f8000003f800000;
      local_12e8 = (float)local_12b8 + 1.0;
      fStack_12e4 = (float)iStack_12b4 + 1.0;
      fStack_12e0 = (float)iStack_12b0 + 1.0;
      fStack_12dc = (float)iStack_12ac + 1.0;
      local_bb8 = 0x3f3504f33f3504f3;
      uStack_bb0 = 0x3f3504f33f3504f3;
      local_ba8._0_4_ = (float)local_fe8;
      local_ba8._4_4_ = (float)(local_fe8 >> 0x20);
      uStack_ba0._0_4_ = (float)uStack_fe0;
      uStack_ba0._4_4_ = (float)(uStack_fe0 >> 0x20);
      local_12f8 = -(uint)((float)local_ba8 < 0.70710677);
      iStack_12f4 = -(uint)(local_ba8._4_4_ < 0.70710677);
      iStack_12f0 = -(uint)((float)uStack_ba0 < 0.70710677);
      iStack_12ec = -(uint)(uStack_ba0._4_4_ < 0.70710677);
      local_c88 = CONCAT44(iStack_12f4,local_12f8);
      uStack_c80 = CONCAT44(iStack_12ec,iStack_12f0);
      local_1308 = local_fe8 & local_c88;
      uStack_1300 = uStack_fe0 & uStack_c80;
      local_ff8 = 0x3f8000003f800000;
      uStack_ff0 = 0x3f8000003f800000;
      local_12a8 = CONCAT44(local_ba8._4_4_ - 1.0,(float)local_ba8 - 1.0);
      uStack_12a0._0_4_ = (float)uStack_ba0 - 1.0;
      uStack_12a0._4_4_ = uStack_ba0._4_4_ - 1.0;
      local_1008 = CONCAT44(fStack_12e4,local_12e8);
      uStack_1000 = CONCAT44(fStack_12dc,fStack_12e0);
      local_c98 = 0x3f8000003f800000;
      uStack_c90 = 0x3f8000003f800000;
      local_ca8 = CONCAT44(iStack_12f4,local_12f8);
      uStack_ca0 = CONCAT44(iStack_12ec,iStack_12f0);
      uVar22 = local_ca8 & 0x3f8000003f800000;
      uVar23 = uStack_ca0 & 0x3f8000003f800000;
      local_1018._0_4_ = (float)uVar22;
      local_1018._4_4_ = (float)(uVar22 >> 0x20);
      uStack_1010._0_4_ = (float)uVar23;
      uStack_1010._4_4_ = (float)(uVar23 >> 0x20);
      local_12e8 = local_12e8 - (float)local_1018;
      fStack_12e4 = fStack_12e4 - local_1018._4_4_;
      fStack_12e0 = fStack_12e0 - (float)uStack_1010;
      fStack_12dc = fStack_12dc - uStack_1010._4_4_;
      local_1208 = local_12a8;
      uStack_1200 = uStack_12a0;
      local_1218._0_4_ = (float)local_1308;
      local_1218._4_4_ = (float)(local_1308 >> 0x20);
      uStack_1210._0_4_ = (float)uStack_1300;
      uStack_1210._4_4_ = (float)(uStack_1300 >> 0x20);
      local_1218._0_4_ = ((float)local_ba8 - 1.0) + (float)local_1218;
      local_1218._4_4_ = (local_ba8._4_4_ - 1.0) + local_1218._4_4_;
      uStack_1210._0_4_ = ((float)uStack_ba0 - 1.0) + (float)uStack_1210;
      uStack_1210._4_4_ = (uStack_ba0._4_4_ - 1.0) + uStack_1210._4_4_;
      local_12a8 = CONCAT44(local_1218._4_4_,(float)local_1218);
      uStack_12a0._0_4_ = (float)uStack_1210;
      uStack_12a0._4_4_ = uStack_1210._4_4_;
      local_1258 = local_12a8;
      uStack_1250 = uStack_12a0;
      local_1318 = (float)local_1218 * (float)local_1218;
      fStack_1314 = local_1218._4_4_ * local_1218._4_4_;
      fStack_1310 = (float)uStack_1210 * (float)uStack_1210;
      fStack_130c = uStack_1210._4_4_ * uStack_1210._4_4_;
      local_6b0 = &local_1328;
      local_710 = &local_12a8;
      local_3b0 = ::_ps_cephes_log_p1;
      local_388 = 0x3d9021bb3d9021bb;
      uStack_380 = 0x3d9021bb3d9021bb;
      local_398 = local_12a8;
      uStack_390 = uStack_12a0;
      local_368 = (float)local_1218 * 0.070376836;
      fStack_364 = local_1218._4_4_ * 0.070376836;
      fStack_360 = (float)uStack_1210 * 0.070376836;
      fStack_35c = uStack_1210._4_4_ * 0.070376836;
      local_378[0] = -0.1151461;
      local_378[1] = -0.1151461;
      afStack_370[0] = -0.1151461;
      afStack_370[1] = -0.1151461;
      local_1328 = CONCAT44(fStack_364 + -0.1151461,local_368 + -0.1151461);
      uStack_1320 = CONCAT44(fStack_35c + -0.1151461,fStack_360 + -0.1151461);
      local_410 = ::_ps_cephes_log_p2;
      local_3e8 = local_1328;
      uStack_3e0 = uStack_1320;
      local_3f8 = local_12a8;
      uStack_3f0 = uStack_12a0;
      local_3c8 = (local_368 + -0.1151461) * (float)local_1218;
      fStack_3c4 = (fStack_364 + -0.1151461) * local_1218._4_4_;
      fStack_3c0 = (fStack_360 + -0.1151461) * (float)uStack_1210;
      fStack_3bc = (fStack_35c + -0.1151461) * uStack_1210._4_4_;
      local_3d8[0] = 0.116769984;
      local_3d8[1] = 0.116769984;
      afStack_3d0[0] = 0.116769984;
      afStack_3d0[1] = 0.116769984;
      local_1328 = CONCAT44(fStack_3c4 + 0.116769984,local_3c8 + 0.116769984);
      uStack_1320 = CONCAT44(fStack_3bc + 0.116769984,fStack_3c0 + 0.116769984);
      local_470 = ::_ps_cephes_log_p3;
      local_448 = local_1328;
      uStack_440 = uStack_1320;
      local_458 = local_12a8;
      uStack_450 = uStack_12a0;
      local_428 = (local_3c8 + 0.116769984) * (float)local_1218;
      fStack_424 = (fStack_3c4 + 0.116769984) * local_1218._4_4_;
      fStack_420 = (fStack_3c0 + 0.116769984) * (float)uStack_1210;
      fStack_41c = (fStack_3bc + 0.116769984) * uStack_1210._4_4_;
      local_438[0] = -0.12420141;
      local_438[1] = -0.12420141;
      afStack_430[0] = -0.12420141;
      afStack_430[1] = -0.12420141;
      local_1328 = CONCAT44(fStack_424 + -0.12420141,local_428 + -0.12420141);
      uStack_1320 = CONCAT44(fStack_41c + -0.12420141,fStack_420 + -0.12420141);
      local_4d0 = ::_ps_cephes_log_p4;
      local_4a8 = local_1328;
      uStack_4a0 = uStack_1320;
      local_4b8 = local_12a8;
      uStack_4b0 = uStack_12a0;
      local_488 = (local_428 + -0.12420141) * (float)local_1218;
      fStack_484 = (fStack_424 + -0.12420141) * local_1218._4_4_;
      fStack_480 = (fStack_420 + -0.12420141) * (float)uStack_1210;
      fStack_47c = (fStack_41c + -0.12420141) * uStack_1210._4_4_;
      local_498[0] = 0.14249323;
      local_498[1] = 0.14249323;
      afStack_490[0] = 0.14249323;
      afStack_490[1] = 0.14249323;
      local_1328 = CONCAT44(fStack_484 + 0.14249323,local_488 + 0.14249323);
      uStack_1320 = CONCAT44(fStack_47c + 0.14249323,fStack_480 + 0.14249323);
      local_530 = ::_ps_cephes_log_p5;
      local_508 = local_1328;
      uStack_500 = uStack_1320;
      local_518 = local_12a8;
      uStack_510 = uStack_12a0;
      local_4e8 = (local_488 + 0.14249323) * (float)local_1218;
      fStack_4e4 = (fStack_484 + 0.14249323) * local_1218._4_4_;
      fStack_4e0 = (fStack_480 + 0.14249323) * (float)uStack_1210;
      fStack_4dc = (fStack_47c + 0.14249323) * uStack_1210._4_4_;
      local_4f8[0] = -0.16668057;
      local_4f8[1] = -0.16668057;
      afStack_4f0[0] = -0.16668057;
      afStack_4f0[1] = -0.16668057;
      local_1328 = CONCAT44(fStack_4e4 + -0.16668057,local_4e8 + -0.16668057);
      uStack_1320 = CONCAT44(fStack_4dc + -0.16668057,fStack_4e0 + -0.16668057);
      local_590 = ::_ps_cephes_log_p6;
      local_568 = local_1328;
      uStack_560 = uStack_1320;
      local_578 = local_12a8;
      uStack_570 = uStack_12a0;
      local_548 = (local_4e8 + -0.16668057) * (float)local_1218;
      fStack_544 = (fStack_4e4 + -0.16668057) * local_1218._4_4_;
      fStack_540 = (fStack_4e0 + -0.16668057) * (float)uStack_1210;
      fStack_53c = (fStack_4dc + -0.16668057) * uStack_1210._4_4_;
      local_558[0] = 0.20000714;
      local_558[1] = 0.20000714;
      afStack_550[0] = 0.20000714;
      afStack_550[1] = 0.20000714;
      local_1328 = CONCAT44(fStack_544 + 0.20000714,local_548 + 0.20000714);
      uStack_1320 = CONCAT44(fStack_53c + 0.20000714,fStack_540 + 0.20000714);
      local_5f0 = ::_ps_cephes_log_p7;
      local_5c8 = local_1328;
      uStack_5c0 = uStack_1320;
      local_5d8 = local_12a8;
      uStack_5d0 = uStack_12a0;
      local_5a8 = (local_548 + 0.20000714) * (float)local_1218;
      fStack_5a4 = (fStack_544 + 0.20000714) * local_1218._4_4_;
      fStack_5a0 = (fStack_540 + 0.20000714) * (float)uStack_1210;
      fStack_59c = (fStack_53c + 0.20000714) * uStack_1210._4_4_;
      local_5b8[0] = -0.24999994;
      local_5b8[1] = -0.24999994;
      afStack_5b0[0] = -0.24999994;
      afStack_5b0[1] = -0.24999994;
      local_1328 = CONCAT44(fStack_5a4 + -0.24999994,local_5a8 + -0.24999994);
      uStack_1320 = CONCAT44(fStack_59c + -0.24999994,fStack_5a0 + -0.24999994);
      local_650 = ::_ps_cephes_log_p8;
      local_628 = local_1328;
      uStack_620 = uStack_1320;
      local_638 = local_12a8;
      uStack_630 = uStack_12a0;
      local_608 = (local_5a8 + -0.24999994) * (float)local_1218;
      fStack_604 = (fStack_5a4 + -0.24999994) * local_1218._4_4_;
      fStack_600 = (fStack_5a0 + -0.24999994) * (float)uStack_1210;
      fStack_5fc = (fStack_59c + -0.24999994) * uStack_1210._4_4_;
      local_618[0] = 0.3333333;
      local_618[1] = 0.3333333;
      afStack_610[0] = 0.3333333;
      afStack_610[1] = 0.3333333;
      local_1328 = CONCAT44(fStack_604 + 0.3333333,local_608 + 0.3333333);
      uStack_1320 = CONCAT44(fStack_5fc + 0.3333333,fStack_600 + 0.3333333);
      local_1268 = local_1328;
      uStack_1260 = uStack_1320;
      local_1278 = local_12a8;
      uStack_1270 = uStack_12a0;
      fVar16 = (local_608 + 0.3333333) * (float)local_1218;
      fVar18 = (fStack_604 + 0.3333333) * local_1218._4_4_;
      fVar19 = (fStack_600 + 0.3333333) * (float)uStack_1210;
      fVar20 = (fStack_5fc + 0.3333333) * uStack_1210._4_4_;
      local_1328 = CONCAT44(fVar18,fVar16);
      uStack_1320 = CONCAT44(fVar20,fVar19);
      local_1288 = local_1328;
      uStack_1280 = uStack_1320;
      local_1298 = CONCAT44(fStack_1314,local_1318);
      uStack_1290 = CONCAT44(fStack_130c,fStack_1310);
      fVar16 = fVar16 * local_1318;
      fVar18 = fVar18 * fStack_1314;
      fVar19 = fVar19 * fStack_1310;
      fVar20 = fVar20 * fStack_130c;
      local_1328 = CONCAT44(fVar18,fVar16);
      uStack_1320 = CONCAT44(fVar20,fVar19);
      local_700 = &local_12e8;
      local_6a8 = ::_ps_cephes_log_q1;
      local_688 = CONCAT44(fStack_12e4,local_12e8);
      uStack_680 = CONCAT44(fStack_12dc,fStack_12e0);
      local_698[0] = -0.00021219444;
      local_698[1] = -0.00021219444;
      afStack_690[0] = -0.00021219444;
      afStack_690[1] = -0.00021219444;
      local_668 = local_12e8 * -0.00021219444;
      fStack_664 = fStack_12e4 * -0.00021219444;
      fStack_660 = fStack_12e0 * -0.00021219444;
      fStack_65c = fStack_12dc * -0.00021219444;
      local_678 = local_1328;
      uStack_670 = uStack_1320;
      fVar16 = local_668 + fVar16;
      fVar18 = fStack_664 + fVar18;
      fVar19 = fStack_660 + fVar19;
      fVar20 = fStack_65c + fVar20;
      local_1328 = CONCAT44(fVar18,fVar16);
      uStack_1320 = CONCAT44(fVar20,fVar19);
      local_1c0 = &local_1318;
      local_1c8 = ::_ps_0p5;
      local_188 = local_1328;
      uStack_180 = uStack_1320;
      local_1a8 = CONCAT44(fStack_1314,local_1318);
      uStack_1a0 = CONCAT44(fStack_130c,fStack_1310);
      local_1b8[0] = 0.5;
      local_1b8[1] = 0.5;
      afStack_1b0[0] = 0.5;
      afStack_1b0[1] = 0.5;
      local_198 = local_1318 * 0.5;
      fStack_194 = fStack_1314 * 0.5;
      fStack_190 = fStack_1310 * 0.5;
      fStack_18c = fStack_130c * 0.5;
      fVar16 = fVar16 - local_198;
      fVar18 = fVar18 - fStack_194;
      fVar19 = fVar19 - fStack_190;
      fVar20 = fVar20 - fStack_18c;
      local_1328 = CONCAT44(fVar18,fVar16);
      uStack_1320 = CONCAT44(fVar20,fVar19);
      local_1228 = local_12a8;
      uStack_1220 = uStack_12a0;
      local_1238 = local_1328;
      uStack_1230 = uStack_1320;
      local_1218._0_4_ = (float)local_1218 + fVar16;
      local_1218._4_4_ = local_1218._4_4_ + fVar18;
      uStack_1210._0_4_ = (float)uStack_1210 + fVar19;
      uStack_1210._4_4_ = uStack_1210._4_4_ + fVar20;
      local_12a8 = CONCAT44(local_1218._4_4_,(float)local_1218);
      uStack_12a0._0_4_ = (float)uStack_1210;
      uStack_12a0._4_4_ = uStack_1210._4_4_;
      local_708 = ::_ps_cephes_log_q2;
      local_6e8 = CONCAT44(fStack_12e4,local_12e8);
      uStack_6e0 = CONCAT44(fStack_12dc,fStack_12e0);
      local_6f8[0] = 0.6933594;
      local_6f8[1] = 0.6933594;
      afStack_6f0[0] = 0.6933594;
      afStack_6f0[1] = 0.6933594;
      local_6c8 = local_12e8 * 0.6933594;
      fStack_6c4 = fStack_12e4 * 0.6933594;
      fStack_6c0 = fStack_12e0 * 0.6933594;
      fStack_6bc = fStack_12dc * 0.6933594;
      local_6d8 = local_12a8;
      uStack_6d0 = uStack_12a0;
      local_12a8 = CONCAT44(fStack_6c4 + local_1218._4_4_,local_6c8 + (float)local_1218);
      uStack_12a0._0_4_ = fStack_6c0 + (float)uStack_1210;
      uStack_12a0._4_4_ = fStack_6bc + uStack_1210._4_4_;
      local_c38 = local_12a8;
      uStack_c30 = uStack_12a0;
      local_c48 = CONCAT44(iStack_12d4,local_12d8);
      uStack_c40 = CONCAT44(iStack_12cc,iStack_12d0);
      local_1378 = local_12a8 | local_c48;
      uStack_1370 = uStack_12a0 | uStack_c40;
      uStack_12a0 = uStack_1370;
      local_12a8 = local_1378;
      local_105c = 0x3f800000;
      local_1078 = 0x3f800000;
      local_1388 = 0x3f8000003f800000;
      uStack_1380 = 0x3f8000003f800000;
      local_107c = 0x40000000;
      local_1098 = 0x40000000;
      local_1398 = 0x4000000040000000;
      uStack_1390 = 0x4000000040000000;
      local_1338._0_4_ = (float)local_1378;
      local_1338._4_4_ = (float)(local_1378 >> 0x20);
      uStack_1330._0_4_ = (float)uStack_1370;
      uStack_1330._4_4_ = (float)(uStack_1370 >> 0x20);
      local_fa8 = (float)local_1338 * 2.0;
      fStack_fa4 = local_1338._4_4_ * 2.0;
      fStack_fa0 = (float)uStack_1330 * 2.0;
      fStack_f9c = uStack_1330._4_4_ * 2.0;
      local_e3c = 0x3f800000;
      local_e58 = 0x3f800000;
      local_fb8 = 0x3f8000003f800000;
      uStack_fb0 = 0x3f8000003f800000;
      local_dc8 = 0;
      uStack_dc0 = 0;
      local_e08 = 0;
      uStack_e00 = 0;
      local_e18 = CONCAT44(fStack_fa4,local_fa8);
      uStack_e10 = CONCAT44(fStack_f9c,fStack_fa0);
      local_f08 = CONCAT44(0.0 - fStack_fa4,0.0 - local_fa8);
      uStack_f00._0_4_ = 0.0 - fStack_fa0;
      uStack_f00._4_4_ = 0.0 - fStack_f9c;
      local_dd8 = 0;
      uStack_dd0 = 0;
      local_168 = local_f08;
      uStack_160 = uStack_f00;
      auVar14._8_8_ = uStack_f00;
      auVar14._0_8_ = local_f08;
      auVar13._8_8_ = 0x42b0c0a542b0c0a5;
      auVar13._0_8_ = 0x42b0c0a542b0c0a5;
      auVar17 = minps(auVar14,auVar13);
      local_f08 = auVar17._0_8_;
      local_d68 = local_f08;
      uStack_f00 = auVar17._8_8_;
      uStack_d60 = uStack_f00;
      auVar9._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar9._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar17 = maxps(auVar17,auVar9);
      local_f08 = auVar17._0_8_;
      uVar5 = local_f08;
      uStack_f00 = auVar17._8_8_;
      uVar6 = uStack_f00;
      local_ea8._0_4_ = auVar17._0_4_;
      local_ea8._4_4_ = auVar17._4_4_;
      uStack_ea0._0_4_ = auVar17._8_4_;
      uStack_ea0._4_4_ = auVar17._12_4_;
      local_e68 = CONCAT44(local_ea8._4_4_ * 1.442695,(float)local_ea8 * 1.442695);
      uStack_e60 = CONCAT44(uStack_ea0._4_4_ * 1.442695,(float)uStack_ea0 * 1.442695);
      fVar16 = (float)local_ea8 * 1.442695 + 0.5;
      fVar18 = local_ea8._4_4_ * 1.442695 + 0.5;
      fVar19 = (float)uStack_ea0 * 1.442695 + 0.5;
      fVar20 = uStack_ea0._4_4_ * 1.442695 + 0.5;
      local_128 = CONCAT44(fVar18,fVar16);
      uStack_120 = CONCAT44(fVar20,fVar19);
      local_be8 = CONCAT44((int)fVar18,(int)fVar16);
      uStack_be0 = CONCAT44((int)fVar20,(int)fVar19);
      local_f28 = (float)(int)fVar16;
      fStack_f24 = (float)(int)fVar18;
      fStack_f20 = (float)(int)fVar19;
      fStack_f1c = (float)(int)fVar20;
      local_e8 = CONCAT44(fStack_f24,local_f28);
      uStack_e0 = CONCAT44(fStack_f1c,fStack_f20);
      local_f8 = CONCAT44(fVar18,fVar16);
      uStack_f0 = CONCAT44(fVar20,fVar19);
      local_f58 = CONCAT44(-(uint)(fVar18 < fStack_f24),-(uint)(fVar16 < local_f28));
      uStack_f50 = CONCAT44(-(uint)(fVar20 < fStack_f1c),-(uint)(fVar19 < fStack_f20));
      local_cd8 = local_f58;
      uStack_cd0 = uStack_f50;
      local_ce8 = 0x3f8000003f800000;
      uStack_ce0 = 0x3f8000003f800000;
      local_f58 = local_f58 & 0x3f8000003f800000;
      uStack_f50 = uStack_f50 & 0x3f8000003f800000;
      local_e28 = CONCAT44(fStack_f24,local_f28);
      uStack_e20 = CONCAT44(fStack_f1c,fStack_f20);
      local_e38._0_4_ = (float)local_f58;
      local_e38._4_4_ = (float)(local_f58 >> 0x20);
      uStack_e30._0_4_ = (float)uStack_f50;
      uStack_e30._4_4_ = (float)(uStack_f50 >> 0x20);
      local_f28 = local_f28 - (float)local_e38;
      fStack_f24 = fStack_f24 - local_e38._4_4_;
      fStack_f20 = fStack_f20 - (float)uStack_e30;
      fStack_f1c = fStack_f1c - uStack_e30._4_4_;
      local_340 = &local_f28;
      local_2e8 = ::_ps_cephes_exp_C1;
      local_b90 = &local_f08;
      local_2a8 = local_f08;
      uStack_2a0 = uStack_f00;
      local_2c8 = CONCAT44(fStack_f24,local_f28);
      uStack_2c0 = CONCAT44(fStack_f1c,fStack_f20);
      local_2d8[0] = 0.6933594;
      local_2d8[1] = 0.6933594;
      afStack_2d0[0] = 0.6933594;
      afStack_2d0[1] = 0.6933594;
      local_2b8 = local_f28 * 0.6933594;
      fStack_2b4 = fStack_f24 * 0.6933594;
      fStack_2b0 = fStack_f20 * 0.6933594;
      fStack_2ac = fStack_f1c * 0.6933594;
      local_f08 = CONCAT44(local_ea8._4_4_ - fStack_2b4,(float)local_ea8 - local_2b8);
      uStack_f00._0_4_ = (float)uStack_ea0 - fStack_2b0;
      uStack_f00._4_4_ = uStack_ea0._4_4_ - fStack_2ac;
      local_348 = ::_ps_cephes_exp_C2;
      local_308 = local_f08;
      uStack_300 = uStack_f00;
      local_328 = CONCAT44(fStack_f24,local_f28);
      uStack_320 = CONCAT44(fStack_f1c,fStack_f20);
      local_338[0] = -0.00021219444;
      local_338[1] = -0.00021219444;
      afStack_330[0] = -0.00021219444;
      afStack_330[1] = -0.00021219444;
      local_318 = local_f28 * -0.00021219444;
      fStack_314 = fStack_f24 * -0.00021219444;
      fStack_310 = fStack_f20 * -0.00021219444;
      fStack_30c = fStack_f1c * -0.00021219444;
      fVar16 = ((float)local_ea8 - local_2b8) - local_318;
      fVar18 = (local_ea8._4_4_ - fStack_2b4) - fStack_314;
      fVar19 = ((float)uStack_ea0 - fStack_2b0) - fStack_310;
      fVar20 = (uStack_ea0._4_4_ - fStack_2ac) - fStack_30c;
      local_f08 = CONCAT44(fVar18,fVar16);
      uStack_f00._0_4_ = fVar19;
      uStack_f00._4_4_ = fVar20;
      local_ed8 = local_f08;
      uStack_ed0 = uStack_f00;
      local_f18 = fVar16 * fVar16;
      fStack_f14 = fVar18 * fVar18;
      fStack_f10 = fVar19 * fVar19;
      fStack_f0c = fVar20 * fVar20;
      local_b80 = &local_f68;
      local_9b0 = ::_ps_cephes_exp_p1;
      local_988 = 0x3950696739506967;
      uStack_980 = 0x3950696739506967;
      local_998 = local_f08;
      uStack_990 = uStack_f00;
      local_968 = fVar16 * 0.00019875691;
      fStack_964 = fVar18 * 0.00019875691;
      fStack_960 = fVar19 * 0.00019875691;
      fStack_95c = fVar20 * 0.00019875691;
      local_978[0] = 0.0013981999;
      local_978[1] = 0.0013981999;
      afStack_970[0] = 0.0013981999;
      afStack_970[1] = 0.0013981999;
      local_f68 = CONCAT44(fStack_964 + 0.0013981999,local_968 + 0.0013981999);
      uStack_f60 = CONCAT44(fStack_95c + 0.0013981999,fStack_960 + 0.0013981999);
      local_a10 = ::_ps_cephes_exp_p2;
      local_9e8 = local_f68;
      uStack_9e0 = uStack_f60;
      local_9f8 = local_f08;
      uStack_9f0 = uStack_f00;
      local_9c8 = (local_968 + 0.0013981999) * fVar16;
      fStack_9c4 = (fStack_964 + 0.0013981999) * fVar18;
      fStack_9c0 = (fStack_960 + 0.0013981999) * fVar19;
      fStack_9bc = (fStack_95c + 0.0013981999) * fVar20;
      local_9d8[0] = 0.008333452;
      local_9d8[1] = 0.008333452;
      afStack_9d0[0] = 0.008333452;
      afStack_9d0[1] = 0.008333452;
      local_f68 = CONCAT44(fStack_9c4 + 0.008333452,local_9c8 + 0.008333452);
      uStack_f60 = CONCAT44(fStack_9bc + 0.008333452,fStack_9c0 + 0.008333452);
      local_a70 = ::_ps_cephes_exp_p3;
      local_a48 = local_f68;
      uStack_a40 = uStack_f60;
      local_a58 = local_f08;
      uStack_a50 = uStack_f00;
      local_a28 = (local_9c8 + 0.008333452) * fVar16;
      fStack_a24 = (fStack_9c4 + 0.008333452) * fVar18;
      fStack_a20 = (fStack_9c0 + 0.008333452) * fVar19;
      fStack_a1c = (fStack_9bc + 0.008333452) * fVar20;
      local_a38[0] = 0.041665796;
      local_a38[1] = 0.041665796;
      afStack_a30[0] = 0.041665796;
      afStack_a30[1] = 0.041665796;
      local_f68 = CONCAT44(fStack_a24 + 0.041665796,local_a28 + 0.041665796);
      uStack_f60 = CONCAT44(fStack_a1c + 0.041665796,fStack_a20 + 0.041665796);
      local_ad0 = ::_ps_cephes_exp_p4;
      local_aa8 = local_f68;
      uStack_aa0 = uStack_f60;
      local_ab8 = local_f08;
      uStack_ab0 = uStack_f00;
      local_a88 = (local_a28 + 0.041665796) * fVar16;
      fStack_a84 = (fStack_a24 + 0.041665796) * fVar18;
      fStack_a80 = (fStack_a20 + 0.041665796) * fVar19;
      fStack_a7c = (fStack_a1c + 0.041665796) * fVar20;
      local_a98[0] = 0.16666666;
      local_a98[1] = 0.16666666;
      afStack_a90[0] = 0.16666666;
      afStack_a90[1] = 0.16666666;
      local_f68 = CONCAT44(fStack_a84 + 0.16666666,local_a88 + 0.16666666);
      uStack_f60 = CONCAT44(fStack_a7c + 0.16666666,fStack_a80 + 0.16666666);
      local_b30 = ::_ps_cephes_exp_p5;
      local_b08 = local_f68;
      uStack_b00 = uStack_f60;
      local_b18 = local_f08;
      uStack_b10 = uStack_f00;
      local_ae8 = (local_a88 + 0.16666666) * fVar16;
      fStack_ae4 = (fStack_a84 + 0.16666666) * fVar18;
      fStack_ae0 = (fStack_a80 + 0.16666666) * fVar19;
      fStack_adc = (fStack_a7c + 0.16666666) * fVar20;
      local_af8[0] = 0.5;
      local_af8[1] = 0.5;
      afStack_af0[0] = 0.5;
      afStack_af0[1] = 0.5;
      local_f68 = CONCAT44(fStack_ae4 + 0.5,local_ae8 + 0.5);
      uStack_f60 = CONCAT44(fStack_adc + 0.5,fStack_ae0 + 0.5);
      local_b88 = &local_f18;
      local_b68 = local_f68;
      uStack_b60 = uStack_f60;
      local_b78 = CONCAT44(fStack_f14,local_f18);
      uStack_b70 = CONCAT44(fStack_f0c,fStack_f10);
      local_b48 = (local_ae8 + 0.5) * local_f18;
      fStack_b44 = (fStack_ae4 + 0.5) * fStack_f14;
      fStack_b40 = (fStack_ae0 + 0.5) * fStack_f10;
      fStack_b3c = (fStack_adc + 0.5) * fStack_f0c;
      local_b58 = local_f08;
      uStack_b50 = uStack_f00;
      local_f68 = CONCAT44(fStack_b44 + fVar18,local_b48 + fVar16);
      uStack_f60 = CONCAT44(fStack_b3c + fVar20,fStack_b40 + fVar19);
      local_e88 = local_f68;
      uStack_e80 = uStack_f60;
      local_e98 = 0x3f8000003f800000;
      uStack_e90 = 0x3f8000003f800000;
      local_df8 = local_b48 + fVar16 + 1.0;
      fStack_df4 = fStack_b44 + fVar18 + 1.0;
      fStack_df0 = fStack_b40 + fVar19 + 1.0;
      fStack_dec = fStack_b3c + fVar20 + 1.0;
      local_f68 = CONCAT44(fStack_df4,local_df8);
      uStack_f60 = CONCAT44(fStack_dec,fStack_df0);
      local_138 = CONCAT44(fStack_f24,local_f28);
      uStack_130 = CONCAT44(fStack_f1c,fStack_f20);
      local_a8 = CONCAT44((int)fStack_f24,(int)local_f28);
      uStack_a0 = CONCAT44((int)fStack_f1c,(int)fStack_f20);
      iVar21 = (int)local_f28 + 0x7f;
      fStack_f34 = (float)((int)fStack_f24 + 0x7f);
      fStack_f30 = (float)((int)fStack_f20 + 0x7f);
      fStack_f2c = (float)((int)fStack_f1c + 0x7f);
      local_68 = CONCAT44(fStack_f34,iVar21);
      uStack_60 = CONCAT44(fStack_f2c,fStack_f30);
      local_6c = 0x17;
      local_f38 = (float)(iVar21 * 0x800000);
      local_f78 = CONCAT44(fStack_f34,local_f38);
      uStack_f70 = CONCAT44(fStack_f2c,fStack_f30);
      local_ee8 = local_f68;
      uStack_ee0 = uStack_f60;
      local_df8 = local_df8 * local_f38;
      fStack_df4 = fStack_df4 * fStack_f34;
      fStack_df0 = fStack_df0 * fStack_f30;
      fStack_dec = fStack_dec * fStack_f2c;
      local_f68 = CONCAT44(fStack_df4,local_df8);
      uStack_f60 = CONCAT44(fStack_dec,fStack_df0);
      local_f98 = local_f68;
      uStack_f90 = uStack_f60;
      local_df8 = local_df8 + 1.0;
      fStack_df4 = fStack_df4 + 1.0;
      fStack_df0 = fStack_df0 + 1.0;
      fStack_dec = fStack_dec + 1.0;
      auVar8._8_8_ = 0x3f8000003f800000;
      auVar8._0_8_ = 0x3f8000003f800000;
      auVar7._4_4_ = fStack_df4;
      auVar7._0_4_ = local_df8;
      auVar7._8_4_ = fStack_df0;
      auVar7._12_4_ = fStack_dec;
      _local_1358 = divps(auVar8,auVar7);
      local_fc8 = (float)local_1358._0_4_ * 2.0;
      fStack_fc4 = (float)local_1358._4_4_ * 2.0;
      fStack_fc0 = fStack_1350 * 2.0;
      fStack_fbc = fStack_134c * 2.0;
      local_13b8 = local_fc8 - 1.0;
      fStack_13b4 = fStack_fc4 - 1.0;
      fStack_13b0 = fStack_fc0 - 1.0;
      fStack_13ac = fStack_fbc - 1.0;
      local_13a8._0_4_ = (float)local_1478;
      local_13a8._4_4_ = (float)((ulong)local_1478 >> 0x20);
      uStack_13a0._0_4_ = (float)uStack_1470;
      uStack_13a0._4_4_ = (float)((ulong)uStack_1470 >> 0x20);
      local_1568 = CONCAT44(local_13a8._4_4_ * fStack_13b4,(float)local_13a8 * local_13b8);
      uStack_1560 = CONCAT44(uStack_13a0._4_4_ * fStack_13ac,(float)uStack_13a0 * fStack_13b0);
      local_1450 = local_14f8;
      local_1468 = local_1568;
      uStack_1460 = uStack_1560;
      auVar17._8_8_ = uStack_1560;
      auVar17._0_8_ = local_1568;
      *local_14f8 = auVar17;
      local_14f8 = local_14f8 + 1;
      local_13a8 = local_1478;
      uStack_13a0 = uStack_1470;
      local_1368 = local_1398;
      uStack_1360 = uStack_1390;
      local_1348 = local_1398;
      uStack_1340 = uStack_1390;
      local_1338 = local_1378;
      uStack_1330 = uStack_1370;
      local_1248 = local_1258;
      uStack_1240 = uStack_1250;
      local_1218 = local_1308;
      uStack_1210 = uStack_1300;
      local_1188 = local_12c8;
      uStack_1180 = uStack_12c0;
      local_1138 = local_11b8;
      uStack_1130 = uStack_11b0;
      local_1108 = local_1118;
      uStack_1100 = uStack_1110;
      local_10e8 = uVar1;
      uStack_10e0 = uVar2;
      uStack_1094 = local_1098;
      uStack_1090 = local_1098;
      uStack_108c = local_1098;
      uStack_1074 = local_1078;
      uStack_1070 = local_1078;
      uStack_106c = local_1078;
      uStack_1054 = local_1058;
      uStack_1050 = local_1058;
      uStack_104c = local_1058;
      local_1038 = local_1198;
      uStack_1030 = uStack_1190;
      local_1018 = uVar22;
      uStack_1010 = uVar23;
      local_fd8 = local_1388;
      uStack_fd0 = uStack_1380;
      local_f88 = local_fb8;
      uStack_f80 = uStack_fb0;
      local_f48 = local_12c8;
      uStack_f40 = uStack_12c0;
      local_ef8 = local_f78;
      uStack_ef0 = uStack_f70;
      local_ec8 = local_ed8;
      uStack_ec0 = uStack_ed0;
      local_eb8 = local_10f8;
      uStack_eb0 = uStack_10f0;
      local_ea8 = uVar5;
      uStack_ea0 = uVar6;
      local_e78 = local_10b8;
      uStack_e70 = uStack_10b0;
      uStack_e54 = local_e58;
      uStack_e50 = local_e58;
      uStack_e4c = local_e58;
      local_e38 = local_f58;
      uStack_e30 = uStack_f50;
      local_de8 = local_fb8;
      uStack_de0 = uStack_fb0;
      local_d58 = local_d78;
      uStack_d50 = uStack_d70;
      local_d08 = uVar3;
      uStack_d00 = uVar4;
      local_c78 = local_fe8;
      uStack_c70 = uStack_fe0;
      local_c28 = local_10b8;
      uStack_c20 = uStack_10b0;
      local_ba8 = local_fe8;
      uStack_ba0 = uStack_fe0;
      local_b28 = local_b90;
      local_b20 = local_b80;
      local_ac8 = local_b90;
      local_ac0 = local_b80;
      local_a68 = local_b90;
      local_a60 = local_b80;
      local_a08 = local_b90;
      local_a00 = local_b80;
      local_9a8 = local_b90;
      local_9a0 = local_b80;
      local_8e8 = local_950;
      local_8e0 = local_940;
      local_888 = local_950;
      local_880 = local_940;
      local_828 = local_950;
      local_820 = local_940;
      local_7c8 = local_950;
      local_7c0 = local_940;
      local_768 = local_950;
      local_760 = local_940;
      local_6a0 = local_700;
      local_648 = local_710;
      local_640 = local_6b0;
      local_5e8 = local_710;
      local_5e0 = local_6b0;
      local_588 = local_710;
      local_580 = local_6b0;
      local_528 = local_710;
      local_520 = local_6b0;
      local_4c8 = local_710;
      local_4c0 = local_6b0;
      local_468 = local_710;
      local_460 = local_6b0;
      local_408 = local_710;
      local_400 = local_6b0;
      local_3a8 = local_710;
      local_3a0 = local_6b0;
      local_350 = local_b90;
      local_2f0 = local_b90;
      local_2e0 = local_340;
      local_290 = local_950;
      local_230 = local_950;
      local_220 = local_280;
      local_1d0 = local_6b0;
      local_158 = local_178;
      uStack_150 = uStack_170;
      local_148 = local_1478;
      uStack_140 = uStack_1470;
      local_b8 = local_c08;
      uStack_b0 = uStack_c00;
      local_98 = local_c08;
      uStack_90 = uStack_c00;
      local_38 = local_f78;
      uStack_30 = uStack_f70;
      local_28 = local_11b8;
      uStack_20 = uStack_11b0;
    }
    for (; local_1550 < local_14e8; local_1550 = local_1550 + 1) {
      fVar16 = *(float *)*local_14f8;
      fVar18 = expf(*(float *)*local_14f8);
      fVar18 = logf(fVar18 + 1.0);
      fVar18 = tanhf(fVar18);
      *(float *)*local_14f8 = fVar16 * fVar18;
      local_14f8 = (undefined1 (*) [16])(*local_14f8 + 4);
    }
  }
  return 0;
}

Assistant:

int Mish_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = mish_avx512(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = mish_avx(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = mish_sse(_p);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = *ptr * tanhf(logf(expf(*ptr) + 1.f));
            ptr++;
        }
    }

    return 0;
}